

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void Omega_h::copy_into<long>(Read<signed_char> *a,Write<long> *b)

{
  char *file;
  undefined1 local_128 [8];
  type f;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [39];
  ScopedTimer local_69;
  Write<long> *pWStack_68;
  ScopedTimer omega_h_scoped_function_timer;
  Write<long> *b_local;
  Read<signed_char> *a_local;
  ulong local_48;
  ulong local_30;
  ulong local_10;
  
  pWStack_68 = b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,&local_d1);
  std::operator+(local_b0,(char *)local_d0);
  std::__cxx11::to_string((__cxx11 *)&f.a.write_.shared_alloc_.direct_ptr,0x152);
  std::operator+(local_90,local_b0);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_69,"copy_into",file);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&f.a.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->shared_alloc_).alloc & 1) == 0) {
    local_30 = ((b->shared_alloc_).alloc)->size;
  }
  else {
    local_30 = (ulong)(b->shared_alloc_).alloc >> 3;
  }
  if ((int)(local_10 >> 3) == (int)(local_30 >> 3)) {
    Write<long>::Write((Write<long> *)local_128,(Write<int> *)b);
    Read<long>::Read((Read<long> *)&f.b.shared_alloc_.direct_ptr,(Read<int> *)a);
    if (((ulong)(b->shared_alloc_).alloc & 1) == 0) {
      local_48 = ((b->shared_alloc_).alloc)->size;
    }
    else {
      local_48 = (ulong)(b->shared_alloc_).alloc >> 3;
    }
    parallel_for<Omega_h::copy_into<long>(Omega_h::Read<long>,Omega_h::Write<long>)::_lambda(int)_1_>
              ((LO)(local_48 >> 3),(type *)local_128,"copy into kernel");
    copy_into<long>(Omega_h::Read<long>,Omega_h::Write<long>)::{lambda(int)#1}::~Write
              ((_lambda_int__1_ *)local_128);
    ScopedTimer::~ScopedTimer(&local_69);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
       ,0x153);
}

Assistant:

void copy_into(Read<T> a, Write<T> b) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(a.size() == b.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = a[i]; };
  parallel_for(b.size(), f, "copy into kernel");
}